

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O0

JDIMENSION jpeg_read_scanlines(j_decompress_ptr cinfo,JSAMPARRAY scanlines,JDIMENSION max_lines)

{
  undefined4 in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  JDIMENSION row_ctr;
  JDIMENSION local_20;
  undefined4 local_1c;
  undefined8 local_18;
  long *local_10;
  JDIMENSION local_4;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (*(int *)((long)in_RDI + 0x24) != 0xcd) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x14;
    *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x24);
    (**(code **)*in_RDI)(in_RDI);
  }
  if (*(uint *)(local_10 + 0x15) < *(uint *)((long)local_10 + 0x8c)) {
    if (local_10[2] != 0) {
      *(ulong *)(local_10[2] + 8) = (ulong)*(uint *)(local_10 + 0x15);
      *(ulong *)(local_10[2] + 0x10) = (ulong)*(uint *)((long)local_10 + 0x8c);
      (**(code **)local_10[2])(local_10);
    }
    local_20 = 0;
    (**(code **)(local_10[0x45] + 8))(local_10,local_18,&local_20,local_1c);
    *(JDIMENSION *)(local_10 + 0x15) = local_20 + (int)local_10[0x15];
    local_4 = local_20;
  }
  else {
    *(undefined4 *)(*local_10 + 0x28) = 0x7b;
    (**(code **)(*local_10 + 8))(local_10,0xffffffff);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

GLOBAL(JDIMENSION)
jpeg_read_scanlines(j_decompress_ptr cinfo, JSAMPARRAY scanlines,
                    JDIMENSION max_lines)
{
  JDIMENSION row_ctr;

  if (cinfo->global_state != DSTATE_SCANNING)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  if (cinfo->output_scanline >= cinfo->output_height) {
    WARNMS(cinfo, JWRN_TOO_MUCH_DATA);
    return 0;
  }

  /* Call progress monitor hook if present */
  if (cinfo->progress != NULL) {
    cinfo->progress->pass_counter = (long)cinfo->output_scanline;
    cinfo->progress->pass_limit = (long)cinfo->output_height;
    (*cinfo->progress->progress_monitor) ((j_common_ptr)cinfo);
  }

  /* Process some data */
  row_ctr = 0;
  (*cinfo->main->process_data) (cinfo, scanlines, &row_ctr, max_lines);
  cinfo->output_scanline += row_ctr;
  return row_ctr;
}